

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylehelper.cpp
# Opt level: O0

qreal QStyleHelper::angle(QPointF *p1,QPointF *p2)

{
  QPointF *in_RSI;
  QPointF *in_RDI;
  qreal qVar1;
  qreal qVar2;
  double dVar3;
  qreal m;
  qreal y2;
  qreal y1;
  qreal x2;
  qreal x1;
  qreal _angle;
  undefined8 local_18;
  
  qVar1 = QPointF::x(in_RDI);
  qVar2 = QPointF::x(in_RSI);
  if ((qVar1 != qVar2) || (NAN(qVar1) || NAN(qVar2))) {
    qVar1 = QPointF::x(in_RDI);
    qVar2 = QPointF::x(in_RSI);
    if (qVar2 < qVar1) {
      QPointF::x(in_RDI);
      QPointF::y(in_RDI);
      QPointF::x(in_RSI);
      QPointF::y(in_RSI);
    }
    else {
      QPointF::x(in_RDI);
      QPointF::y(in_RDI);
      QPointF::x(in_RSI);
      QPointF::y(in_RSI);
    }
    dVar3 = qAtan<double>(2.11778027663152e-317);
    qVar1 = QPointF::x(in_RDI);
    qVar2 = QPointF::x(in_RSI);
    if (qVar2 <= qVar1) {
      local_18 = -(dVar3 * 57.29577951308232);
    }
    else {
      local_18 = 180.0 - dVar3 * 57.29577951308232;
    }
  }
  else {
    qVar1 = QPointF::y(in_RDI);
    qVar2 = QPointF::y(in_RSI);
    if (qVar2 <= qVar1) {
      local_18 = 90.0;
    }
    else {
      local_18 = 270.0;
    }
  }
  return local_18;
}

Assistant:

qreal angle(const QPointF &p1, const QPointF &p2)
{
    static const qreal rad_factor = 180 / Q_PI;
    qreal _angle = 0;

    if (p1.x() == p2.x()) {
        if (p1.y() < p2.y())
            _angle = 270;
        else
            _angle = 90;
    } else  {
        qreal x1, x2, y1, y2;

        if (p1.x() <= p2.x()) {
            x1 = p1.x(); y1 = p1.y();
            x2 = p2.x(); y2 = p2.y();
        } else {
            x2 = p1.x(); y2 = p1.y();
            x1 = p2.x(); y1 = p2.y();
        }

        qreal m = -(y2 - y1) / (x2 - x1);
        _angle = qAtan(m) *  rad_factor;

        if (p1.x() < p2.x())
            _angle = 180 - _angle;
        else
            _angle = -_angle;
    }
    return _angle;
}